

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void testing::internal::XmlUnitTestResultPrinter::OutputXmlTestInfo
               (ostream *stream,char *test_case_name,TestInfo *test_info)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  TestPartResult *pTVar2;
  ostream *poVar3;
  int line;
  TimeInMillis ms;
  TestResult *result;
  pointer pcVar4;
  char *pcVar5;
  internal *this;
  int iVar6;
  int i;
  string location;
  allocator<char> local_c1;
  string summary;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string detail;
  string kTestcase;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&kTestcase,"testcase",(allocator<char> *)&location);
  std::operator<<(stream,"    <testcase");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&location,"name",(allocator<char> *)&detail);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&summary,(test_info->name_)._M_dataplus._M_p,(allocator<char> *)&local_98);
  OutputXmlAttribute(stream,&kTestcase,&location,&summary);
  std::__cxx11::string::~string((string *)&summary);
  std::__cxx11::string::~string((string *)&location);
  pbVar1 = (test_info->value_param_).ptr_;
  if ((pbVar1 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
     ((pbVar1->_M_dataplus)._M_p != (pointer)0x0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&location,"value_param",(allocator<char> *)&detail);
    pbVar1 = (test_info->value_param_).ptr_;
    if (pbVar1 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = (char *)0x0;
    }
    else {
      pcVar4 = (pbVar1->_M_dataplus)._M_p;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&summary,pcVar4,(allocator<char> *)&local_98);
    OutputXmlAttribute(stream,&kTestcase,&location,&summary);
    std::__cxx11::string::~string((string *)&summary);
    std::__cxx11::string::~string((string *)&location);
  }
  pbVar1 = (test_info->type_param_).ptr_;
  if ((pbVar1 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
     ((pbVar1->_M_dataplus)._M_p != (pointer)0x0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&location,"type_param",(allocator<char> *)&detail);
    pbVar1 = (test_info->type_param_).ptr_;
    if (pbVar1 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = (char *)0x0;
    }
    else {
      pcVar4 = (pbVar1->_M_dataplus)._M_p;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&summary,pcVar4,(allocator<char> *)&local_98);
    OutputXmlAttribute(stream,&kTestcase,&location,&summary);
    std::__cxx11::string::~string((string *)&summary);
    std::__cxx11::string::~string((string *)&location);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&location,"status",(allocator<char> *)&detail);
  pcVar5 = "notrun";
  if (test_info->should_run_ != false) {
    pcVar5 = "run";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&summary,pcVar5,(allocator<char> *)&local_98);
  OutputXmlAttribute(stream,&kTestcase,&location,&summary);
  std::__cxx11::string::~string((string *)&summary);
  std::__cxx11::string::~string((string *)&location);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&location,"time",(allocator<char> *)&detail);
  FormatTimeInMillisAsSeconds_abi_cxx11_(&summary,(internal *)(test_info->result_).elapsed_time_,ms)
  ;
  OutputXmlAttribute(stream,&kTestcase,&location,&summary);
  std::__cxx11::string::~string((string *)&summary);
  std::__cxx11::string::~string((string *)&location);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&location,"classname",(allocator<char> *)&detail);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&summary,test_case_name,(allocator<char> *)&local_98);
  OutputXmlAttribute(stream,&kTestcase,&location,&summary);
  std::__cxx11::string::~string((string *)&summary);
  std::__cxx11::string::~string((string *)&location);
  TestPropertiesAsXmlAttributes_abi_cxx11_
            (&location,(XmlUnitTestResultPrinter *)&test_info->result_,result);
  std::operator<<(stream,(string *)&location);
  std::__cxx11::string::~string((string *)&location);
  iVar6 = 0;
  i = 0;
  while( true ) {
    line = 0x70;
    if ((int)(((long)(test_info->result_).test_part_results_.
                     super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)(test_info->result_).test_part_results_.
                    super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x70) <= i) break;
    pTVar2 = TestResult::GetTestPartResult(&test_info->result_,i);
    if (pTVar2->type_ != kSuccess) {
      if (iVar6 == 0) {
        std::operator<<(stream,">\n");
      }
      this = (internal *)(pTVar2->file_name_)._M_string_length;
      if (this != (internal *)0x0) {
        this = (internal *)(pTVar2->file_name_)._M_dataplus._M_p;
      }
      FormatCompilerIndependentFileLocation_abi_cxx11_
                (&location,this,(char *)(ulong)(uint)pTVar2->line_number_,line);
      std::operator+(&detail,&location,"\n");
      std::operator+(&summary,&detail,(pTVar2->summary_)._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&detail);
      poVar3 = std::operator<<(stream,"      <failure message=\"");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,summary._M_dataplus._M_p,&local_c1);
      EscapeXmlAttribute(&detail,&local_98);
      poVar3 = std::operator<<(poVar3,(string *)&detail);
      std::operator<<(poVar3,"\" type=\"\">");
      std::__cxx11::string::~string((string *)&detail);
      std::__cxx11::string::~string((string *)&local_98);
      std::operator+(&local_98,&location,"\n");
      std::operator+(&detail,&local_98,(pTVar2->message_)._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_98);
      RemoveInvalidXmlCharacters(&local_98,&detail);
      OutputXmlCDataSection(stream,local_98._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_98);
      std::operator<<(stream,"</failure>\n");
      iVar6 = iVar6 + 1;
      std::__cxx11::string::~string((string *)&detail);
      std::__cxx11::string::~string((string *)&summary);
      std::__cxx11::string::~string((string *)&location);
    }
    i = i + 1;
  }
  pcVar5 = "    </testcase>\n";
  if (iVar6 == 0) {
    pcVar5 = " />\n";
  }
  std::operator<<(stream,pcVar5);
  std::__cxx11::string::~string((string *)&kTestcase);
  return;
}

Assistant:

void XmlUnitTestResultPrinter::OutputXmlTestInfo(::std::ostream* stream,
                                                 const char* test_case_name,
                                                 const TestInfo& test_info) {
  const TestResult& result = *test_info.result();
  const std::string kTestcase = "testcase";

  *stream << "    <testcase";
  OutputXmlAttribute(stream, kTestcase, "name", test_info.name());

  if (test_info.value_param() != NULL) {
    OutputXmlAttribute(stream, kTestcase, "value_param",
                       test_info.value_param());
  }
  if (test_info.type_param() != NULL) {
    OutputXmlAttribute(stream, kTestcase, "type_param", test_info.type_param());
  }

  OutputXmlAttribute(stream, kTestcase, "status",
                     test_info.should_run() ? "run" : "notrun");
  OutputXmlAttribute(stream, kTestcase, "time",
                     FormatTimeInMillisAsSeconds(result.elapsed_time()));
  OutputXmlAttribute(stream, kTestcase, "classname", test_case_name);
  *stream << TestPropertiesAsXmlAttributes(result);

  int failures = 0;
  for (int i = 0; i < result.total_part_count(); ++i) {
    const TestPartResult& part = result.GetTestPartResult(i);
    if (part.failed()) {
      if (++failures == 1) {
        *stream << ">\n";
      }
      const std::string location =
          internal::FormatCompilerIndependentFileLocation(part.file_name(),
                                                          part.line_number());
      const std::string summary = location + "\n" + part.summary();
      *stream << "      <failure message=\""
              << EscapeXmlAttribute(summary.c_str())
              << "\" type=\"\">";
      const std::string detail = location + "\n" + part.message();
      OutputXmlCDataSection(stream, RemoveInvalidXmlCharacters(detail).c_str());
      *stream << "</failure>\n";
    }
  }

  if (failures == 0)
    *stream << " />\n";
  else
    *stream << "    </testcase>\n";
}